

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_matrix.c
# Opt level: O1

void GPU_VectorApplyMatrix(float *vec3,float *matrix_4x4)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  fVar1 = *vec3;
  fVar2 = vec3[1];
  fVar3 = vec3[2];
  fVar4 = matrix_4x4[5];
  fVar5 = matrix_4x4[1];
  fVar6 = matrix_4x4[9];
  fVar7 = matrix_4x4[0xd];
  fVar8 = matrix_4x4[6];
  fVar9 = matrix_4x4[2];
  fVar10 = matrix_4x4[10];
  fVar11 = matrix_4x4[0xe];
  fVar12 = fVar3 * matrix_4x4[0xb] + fVar1 * matrix_4x4[3] + fVar2 * matrix_4x4[7] + matrix_4x4[0xf]
  ;
  *vec3 = (matrix_4x4[8] * fVar3 + *matrix_4x4 * fVar1 + matrix_4x4[4] * fVar2 + matrix_4x4[0xc]) /
          fVar12;
  vec3[1] = (fVar6 * fVar3 + fVar5 * fVar1 + fVar4 * fVar2 + fVar7) / fVar12;
  vec3[2] = (fVar10 * fVar3 + fVar9 * fVar1 + fVar8 * fVar2 + fVar11) / fVar12;
  return;
}

Assistant:

void GPU_VectorApplyMatrix(float* vec3, const float* matrix_4x4)
{
	float x = matrix_4x4[0] * vec3[0] + matrix_4x4[4] * vec3[1] + matrix_4x4[8] * vec3[2] + matrix_4x4[12];
	float y = matrix_4x4[1] * vec3[0] + matrix_4x4[5] * vec3[1] + matrix_4x4[9] * vec3[2] + matrix_4x4[13];
	float z = matrix_4x4[2] * vec3[0] + matrix_4x4[6] * vec3[1] + matrix_4x4[10] * vec3[2] + matrix_4x4[14];
	float w = matrix_4x4[3] * vec3[0] + matrix_4x4[7] * vec3[1] + matrix_4x4[11] * vec3[2] + matrix_4x4[15];
	vec3[0] = x / w;
	vec3[1] = y / w;
	vec3[2] = z / w;
}